

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

ParseNodeObjLit * __thiscall
Parser::CreateObjectPatternNode
          (Parser *this,ParseNodePtr pnodeMemberList,charcount_t ichMin,charcount_t ichLim,
          bool convertToPattern)

{
  OpCode OVar1;
  ParseNodePtr pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ParseNodeBin *pPVar6;
  ParseNodePtr pPVar7;
  ParseNodeBin *extraout_RAX;
  ParseNode *pnodeMember;
  ParseNodeBin *extraout_RAX_00;
  undefined7 extraout_var;
  ParseNodeType *pPVar8;
  uint uVar9;
  undefined3 in_register_00000081;
  int iVar10;
  uint uVar11;
  undefined1 uVar12;
  ParseNodePtr *ppPVar13;
  ParseNodePtr local_68;
  int local_5c;
  charcount_t local_58;
  charcount_t local_54;
  ParseNodePtr local_50;
  ParseNodePtr pnodeMemberNodeList;
  ParseNodeBin *local_40;
  uint local_34;
  
  iVar10 = CONCAT31(in_register_00000081,convertToPattern);
  uVar11 = 0;
  local_50 = (ParseNodePtr)0x0;
  if (iVar10 == 0) {
    local_50 = pnodeMemberList;
  }
  if (pnodeMemberList == (ParseNodePtr)0x0) {
    uVar9 = 0;
    uVar12 = false;
  }
  else {
    OVar1 = pnodeMemberList->nop;
    local_58 = ichLim;
    local_54 = ichMin;
    if (((OVar1 != knopList && !convertToPattern) && (OVar1 != knopEllipsis)) &&
       (OVar1 != knopObjectPatternMember)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x4c4,
                         "(pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis)"
                         ,
                         "pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis"
                        );
      if (!bVar4) {
LAB_00e7e162:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    ppPVar13 = &local_68;
    local_68 = pnodeMemberList;
    pPVar6 = (ParseNodeBin *)__tls_get_addr(&PTR_0155fe48);
    pnodeMemberNodeList = (ParseNodePtr)pPVar6;
    uVar11 = 0;
    local_34 = 0;
    local_40 = (ParseNodeBin *)0x0;
    local_5c = iVar10;
    do {
      pnodeMember = *ppPVar13;
      if (pnodeMember == (ParseNode *)0x0) break;
      if (pnodeMember->nop == knopList) {
        pPVar6 = ParseNode::AsParseNodeBin(pnodeMember);
        pPVar7 = pPVar6->pnode1;
        if ((char)iVar10 != '\0') {
          pPVar7 = ConvertMemberToMemberPattern(this,pPVar7);
          AppendToList(this,&local_50,pPVar7);
          pPVar6 = extraout_RAX;
        }
        if (pPVar7->nop == knopEllipsis) {
          local_40 = (ParseNodeBin *)CONCAT71((int7)((ulong)pPVar6 >> 8),1);
        }
        else {
          pPVar6 = ParseNode::AsParseNodeBin(pPVar7);
          pPVar7 = pPVar6->pnode1;
          OVar1 = pPVar7->nop;
          if ((OVar1 != knopStr) && (OVar1 != knopComputedName)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pPVar2 = pnodeMemberNodeList;
            pPVar2->nop = knopName;
            pPVar2->field_0x1 = 0;
            pPVar2->grfpn = 0;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x4ce,
                               "(nameNode->nop == knopComputedName || nameNode->nop == knopStr)",
                               "nameNode->nop == knopComputedName || nameNode->nop == knopStr");
            if (!bVar4) goto LAB_00e7e162;
            pPVar2->nop = knopNone;
            pPVar2->field_0x1 = 0;
            pPVar2->grfpn = 0;
            iVar10 = local_5c;
          }
          if (pPVar7->nop == knopComputedName) {
            uVar11 = uVar11 + 1;
          }
          else {
            local_34 = local_34 + 1;
          }
        }
        pPVar6 = ParseNode::AsParseNodeBin(*ppPVar13);
        ppPVar13 = &pPVar6->pnode2;
      }
      else {
        pPVar7 = pnodeMemberNodeList;
        if ((char)iVar10 != '\0') {
          pnodeMember = ConvertMemberToMemberPattern(this,pnodeMember);
          pPVar7 = pnodeMemberNodeList;
          AppendToList(this,&local_50,pnodeMember);
          pPVar6 = extraout_RAX_00;
        }
        if (pnodeMember->nop == knopEllipsis) {
          pPVar6 = (ParseNodeBin *)CONCAT71((int7)((ulong)pPVar6 >> 8),1);
          local_40 = pPVar6;
        }
        else {
          pPVar6 = ParseNode::AsParseNodeBin(pnodeMember);
          pPVar2 = pPVar6->pnode1;
          OVar1 = pPVar2->nop;
          pPVar6 = (ParseNodeBin *)0x0;
          if ((OVar1 != knopStr) && (OVar1 != knopComputedName)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pPVar7->nop = knopName;
            pPVar7->field_0x1 = 0;
            pPVar7->grfpn = 0;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x4ce,
                               "(nameNode->nop == knopComputedName || nameNode->nop == knopStr)",
                               "nameNode->nop == knopComputedName || nameNode->nop == knopStr");
            pPVar6 = (ParseNodeBin *)CONCAT71(extraout_var,bVar4);
            if (!bVar4) goto LAB_00e7e162;
            pPVar7->nop = knopNone;
            pPVar7->field_0x1 = 0;
            pPVar7->grfpn = 0;
          }
          if (pPVar2->nop == knopComputedName) {
            uVar11 = uVar11 + 1;
          }
          else {
            local_34 = local_34 + 1;
          }
        }
        ppPVar13 = (ParseNodePtr *)0x0;
      }
    } while (ppPVar13 != (ParseNodePtr *)0x0);
    uVar12 = SUB81(local_40,0);
    ichLim = local_58;
    ichMin = local_54;
    uVar9 = local_34;
  }
  pPVar8 = CreateNodeForOpT<(OpCode)112>(this,ichMin,ichLim);
  (pPVar8->super_ParseNodeUni).pnode1 = local_50;
  pPVar8->computedCount = uVar11;
  pPVar8->staticCount = uVar9;
  pPVar8->hasRest = (bool)uVar12;
  return pPVar8;
}

Assistant:

ParseNodeObjLit * Parser::CreateObjectPatternNode(ParseNodePtr pnodeMemberList, charcount_t ichMin, charcount_t ichLim, bool convertToPattern) {
    // Count the number of non-rest members in the object
    uint32 staticCount = 0;
    uint32 computedCount = 0;
    bool hasRest = false;
    ParseNodePtr pnodeMemberNodeList = convertToPattern ? nullptr : pnodeMemberList;
    if (pnodeMemberList != nullptr)
    {
        Assert(pnodeMemberList->nop == knopList || 
              (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || 
              convertToPattern ||
              pnodeMemberList->nop == knopEllipsis);
        ForEachItemInList(pnodeMemberList, [&](ParseNodePtr item) {
            ParseNodePtr memberNode = convertToPattern ? ConvertMemberToMemberPattern(item) : item;
            if (convertToPattern)
            {
                AppendToList(&pnodeMemberNodeList, memberNode);
            }
            if (memberNode->nop != knopEllipsis)
            {
                ParseNodePtr nameNode = memberNode->AsParseNodeBin()->pnode1;
                Assert(nameNode->nop == knopComputedName || nameNode->nop == knopStr);
                if (nameNode->nop == knopComputedName)
                {
                    computedCount++;
                }
                else
                {
                    staticCount++;
                }
            }
            else
            {
                hasRest = true;
            }
        });
    }

    ParseNodeObjLit * objectPatternNode = CreateNodeForOpT<knopObjectPattern>(ichMin, ichLim);
    objectPatternNode->pnode1 = pnodeMemberNodeList;
    objectPatternNode->computedCount = computedCount;
    objectPatternNode->staticCount = staticCount;
    objectPatternNode->hasRest = hasRest;
    return objectPatternNode;
}